

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1chord_angle.cc
# Opt level: O0

double sin2(S1ChordAngle a)

{
  bool bVar1;
  ostream *poVar2;
  double dVar3;
  double dVar4;
  S2LogMessage local_28;
  S2LogMessageVoidify local_11;
  S1ChordAngle local_10;
  S1ChordAngle a_local;
  
  local_10.length2_ = a.length2_;
  bVar1 = S1ChordAngle::is_special(&local_10);
  if (!bVar1) {
    dVar3 = S1ChordAngle::length2(&local_10);
    dVar4 = S1ChordAngle::length2(&local_10);
    return dVar3 * (1.0 - dVar4 * 0.25);
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1chord_angle.cc"
             ,0x86,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_28);
  poVar2 = std::operator<<(poVar2,"Check failed: !a.is_special() ");
  S2LogMessageVoidify::operator&(&local_11,poVar2);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
}

Assistant:

double sin2(S1ChordAngle a) {
  S2_DCHECK(!a.is_special());
  // Let "a" be the (non-squared) chord length, and let A be the corresponding
  // half-angle (a = 2*sin(A)).  The formula below can be derived from:
  //   sin(2*A) = 2 * sin(A) * cos(A)
  //   cos^2(A) = 1 - sin^2(A)
  // This is much faster than converting to an angle and computing its sine.
  return a.length2() * (1 - 0.25 * a.length2());
}